

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::add_sample
          (TypedTimeSamples<tinyusdz::value::color3f> *this,double t,color3f *v)

{
  pointer *ppSVar1;
  iterator __position;
  undefined4 uVar2;
  Sample s;
  Sample local_20;
  
  uVar2 = local_20._20_4_;
  local_20._20_4_ = local_20._20_4_ & 0xffffff00;
  local_20.value.b = v->b;
  local_20.value.r = v->r;
  local_20.value.g = v->g;
  __position._M_current =
       (this->_samples).
       super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.t = t;
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>>
    ::_M_realloc_insert<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample&>
              ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>>
                *)this,__position,&local_20);
  }
  else {
    *(ulong *)&((__position._M_current)->value).b =
         CONCAT44(uVar2,local_20.value.b) & 0xffffff00ffffffff;
    (__position._M_current)->t = t;
    ((__position._M_current)->value).r = local_20.value.r;
    ((__position._M_current)->value).g = local_20.value.g;
    ppSVar1 = &(this->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }